

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device_ping.cpp
# Opt level: O2

bool __thiscall dev_ping::Impl::getsockaddr(Impl *this,char *host,sockaddr_in *sockaddr)

{
  in_addr_t iVar1;
  char *pcVar2;
  hostent *phVar3;
  char cVar4;
  
  sockaddr->sin_family = 2;
  sockaddr->sin_port = 0;
  sockaddr->sin_addr = 0;
  if ((host == (char *)0x0) || (cVar4 = *host, cVar4 == '\0')) {
    (sockaddr->sin_addr).s_addr = 0;
  }
  else {
    pcVar2 = host + 1;
    while (cVar4 != '\0') {
      if (9 < (byte)(cVar4 - 0x30U) && cVar4 != '.') {
        phVar3 = gethostbyname(host);
        if (phVar3 == (hostent *)0x0) {
          return false;
        }
        iVar1 = *(in_addr_t *)*phVar3->h_addr_list;
        goto LAB_001043a0;
      }
      cVar4 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    }
    iVar1 = inet_addr(host);
LAB_001043a0:
    (sockaddr->sin_addr).s_addr = iVar1;
  }
  return true;
}

Assistant:

bool dev_ping::Impl::getsockaddr(const char *host, sockaddr_in *sockaddr)
{
    memset(static_cast<void *>(sockaddr), 0, sizeof(sockaddr));
    sockaddr->sin_family = AF_INET;

    bool rc = true;
    if (host == NULL || host[0] == '\0') {
        sockaddr->sin_addr.s_addr = htonl(INADDR_ANY);
    }
    else {
        char c;
        const char *p = host;
        bool is_ipaddr = true;
        while ((c = (*p++)) != '\0') {
            if ((c != '.') && (!((c >= '0') && (c <= '9')))) {
                is_ipaddr = false;
                break;
            }
        }

        if (is_ipaddr) {
            sockaddr->sin_addr.s_addr = inet_addr(host);
        }
        else {
            struct hostent *hostname = gethostbyname(host);
            if (hostname != NULL) {
                memcpy(&(sockaddr->sin_addr), *(hostname->h_addr_list), sizeof(struct in_addr));
            }
            else {
                rc = false;
            }
        }
    }
    return rc;
}